

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_nonce_process
              (secp256k1_context *ctx,secp256k1_musig_session *session,
              secp256k1_musig_aggnonce *aggnonce,uchar *msg32,
              secp256k1_musig_keyagg_cache *keyagg_cache)

{
  int iVar1;
  undefined4 extraout_EAX;
  long lVar2;
  secp256k1_ge *psVar3;
  uint64_t *puVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  uchar fin_nonce [32];
  uchar agg_pk32 [32];
  secp256k1_ge fin_nonce_pt;
  secp256k1_gej fin_nonce_ptj;
  uchar noncehash [32];
  secp256k1_ge aggnonce_pts [2];
  secp256k1_keyagg_cache_internal cache_i;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  uchar local_378 [32];
  undefined1 local_358 [32];
  undefined1 local_338;
  secp256k1_fe local_330;
  int local_308;
  uint local_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined8 uStack_2f4;
  undefined8 local_2ec;
  undefined8 uStack_2e4;
  secp256k1_scalar local_2d8;
  secp256k1_scalar local_2b8;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  secp256k1_gej local_278;
  uchar local_1f8 [32];
  secp256k1_ge local_1d8 [2];
  secp256k1_keyagg_cache_internal local_128;
  
  bVar5 = 0;
  if (session == (secp256k1_musig_session *)0x0) {
    secp256k1_musig_nonce_process_cold_4();
  }
  else if (aggnonce == (secp256k1_musig_aggnonce *)0x0) {
    secp256k1_musig_nonce_process_cold_3();
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_musig_nonce_process_cold_2();
  }
  else {
    if (keyagg_cache != (secp256k1_musig_keyagg_cache *)0x0) {
      iVar1 = secp256k1_keyagg_cache_load(ctx,&local_128,keyagg_cache);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_fe_impl_get_b32(local_378,(secp256k1_fe *)&local_128);
      iVar1 = secp256k1_musig_aggnonce_load(ctx,local_1d8,aggnonce);
      if (iVar1 == 0) {
        return 0;
      }
      local_278.x.n[0] = 0x6bf7e532c7d5a45;
      local_278.x.n[1] = 0x971254c089be68a6;
      local_278.x.n[2] = 0x72846dcd60ac12d2;
      local_278.x.n[3] = 0xde7a25006c81212f;
      local_278.z.n[2] = 0x40;
      lVar2 = 0;
      do {
        if (*(int *)((long)(&local_1d8[0].y + 1) + lVar2) == 0) {
          local_300 = 0x21;
          uStack_2fc = 0;
          secp256k1_eckey_pubkey_serialize
                    ((secp256k1_ge *)((long)local_1d8[0].x.n + lVar2),local_358,(size_t *)&local_300
                     ,1);
        }
        else {
          local_358._16_16_ = (undefined1  [16])0x0;
          local_358._0_16_ = (undefined1  [16])0x0;
          local_338 = 0;
        }
        secp256k1_sha256_write((secp256k1_sha256 *)&local_278,local_358,0x21);
        lVar2 = lVar2 + 0x58;
      } while (lVar2 == 0x58);
      secp256k1_sha256_write((secp256k1_sha256 *)&local_278,local_378,0x20);
      secp256k1_sha256_write((secp256k1_sha256 *)&local_278,msg32,0x20);
      secp256k1_sha256_finalize((secp256k1_sha256 *)&local_278,local_1f8);
      secp256k1_scalar_set_b32(&local_2d8,local_1f8,(int *)0x0);
      secp256k1_effective_nonce(&local_278,local_1d8,&local_2d8);
      secp256k1_ge_set_gej((secp256k1_ge *)local_358,&local_278);
      if (local_308 != 0) {
        psVar3 = &secp256k1_ge_const_g;
        puVar4 = (uint64_t *)local_358;
        for (lVar2 = 0xb; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar4 = (psVar3->x).n[0];
          psVar3 = (secp256k1_ge *)((long)psVar3 + ((ulong)bVar5 * -2 + 1) * 8);
          puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
        }
      }
      secp256k1_fe_impl_normalize_var((secp256k1_fe *)local_358);
      secp256k1_fe_impl_get_b32((uchar *)&local_398,(secp256k1_fe *)local_358);
      secp256k1_fe_impl_normalize_var(&local_330);
      local_300 = (uint)local_330.n[0] & 1;
      secp256k1_schnorrsig_challenge(&local_2b8,(uchar *)&local_398,msg32,0x20,local_378);
      local_288 = (undefined1  [16])0x0;
      local_298 = (undefined1  [16])0x0;
      auVar6._0_4_ = -(uint)((int)local_128.tweak.d[2] == 0 && (int)local_128.tweak.d[0] == 0);
      auVar6._4_4_ = -(uint)(local_128.tweak.d[2]._4_4_ == 0 && local_128.tweak.d[0]._4_4_ == 0);
      auVar6._8_4_ = -(uint)((int)local_128.tweak.d[3] == 0 && (int)local_128.tweak.d[1] == 0);
      auVar6._12_4_ = -(uint)(local_128.tweak.d[3]._4_4_ == 0 && local_128.tweak.d[1]._4_4_ == 0);
      iVar1 = movmskps(extraout_EAX,auVar6);
      if (iVar1 != 0xf) {
        secp256k1_scalar_mul((secp256k1_scalar *)&local_278,&local_2b8,&local_128.tweak);
        if (((byte)local_128.pk.y.n[0] & 1) != 0) {
          secp256k1_scalar_negate((secp256k1_scalar *)&local_278,(secp256k1_scalar *)&local_278);
        }
        local_288._8_8_ = local_278.x.n[3];
        local_288._0_8_ = local_278.x.n[2];
        local_298._8_8_ = local_278.x.n[1];
        local_298._0_8_ = local_278.x.n[0];
      }
      local_2ec = local_388;
      uStack_2e4 = uStack_380;
      uStack_2fc = (undefined4)local_398;
      uStack_2f8 = (undefined4)((ulong)local_398 >> 0x20);
      uStack_2f4 = uStack_390;
      session->data[0] = 0x9d;
      session->data[1] = 0xed;
      session->data[2] = 0xe9;
      session->data[3] = '\x17';
      session->data[4] = (uchar)local_300;
      *(undefined8 *)(session->data + 5) = local_398;
      *(undefined8 *)(session->data + 0xd) = uStack_390;
      *(undefined8 *)(session->data + 0x15) = local_388;
      *(undefined8 *)(session->data + 0x1d) = uStack_380;
      secp256k1_scalar_get_b32(session->data + 0x25,&local_2d8);
      secp256k1_scalar_get_b32(session->data + 0x45,&local_2b8);
      secp256k1_scalar_get_b32(session->data + 0x65,(secp256k1_scalar *)local_298);
      return 1;
    }
    secp256k1_musig_nonce_process_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_musig_nonce_process(const secp256k1_context* ctx, secp256k1_musig_session *session, const secp256k1_musig_aggnonce  *aggnonce, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache) {
    secp256k1_keyagg_cache_internal cache_i;
    secp256k1_ge aggnonce_pts[2];
    unsigned char fin_nonce[32];
    secp256k1_musig_session_internal session_i;
    unsigned char agg_pk32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(session != NULL);
    ARG_CHECK(aggnonce != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(keyagg_cache != NULL);

    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        return 0;
    }
    secp256k1_fe_get_b32(agg_pk32, &cache_i.pk.x);

    if (!secp256k1_musig_aggnonce_load(ctx, aggnonce_pts, aggnonce)) {
        return 0;
    }

    secp256k1_musig_nonce_process_internal(&session_i.fin_nonce_parity, fin_nonce, &session_i.noncecoef, aggnonce_pts, agg_pk32, msg32);
    secp256k1_schnorrsig_challenge(&session_i.challenge, fin_nonce, msg32, 32, agg_pk32);

    /* If there is a tweak then set `challenge` times `tweak` to the `s`-part.*/
    secp256k1_scalar_set_int(&session_i.s_part, 0);
    if (!secp256k1_scalar_is_zero(&cache_i.tweak)) {
        secp256k1_scalar e_tmp;
        secp256k1_scalar_mul(&e_tmp, &session_i.challenge, &cache_i.tweak);
        if (secp256k1_fe_is_odd(&cache_i.pk.y)) {
            secp256k1_scalar_negate(&e_tmp, &e_tmp);
        }
        session_i.s_part = e_tmp;
    }
    memcpy(session_i.fin_nonce, fin_nonce, sizeof(session_i.fin_nonce));
    secp256k1_musig_session_save(session, &session_i);
    return 1;
}